

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbt2DsegmentShape::localGetSupportingVertexWithoutMargin(cbt2DsegmentShape *this,cbtVector3 *vec0)

{
  cbtVector3 *pcVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  cbtVector3 cVar6;
  
  fVar2 = vec0->m_floats[1] - *(float *)&this->field_0x48;
  auVar5 = ZEXT416((uint)(vec0->m_floats[0] -
                         *(float *)&(this->super_cbtConvexInternalShape).field_0x44));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),auVar5,auVar5);
  auVar4 = ZEXT416((uint)(vec0->m_floats[2] - *(float *)&this->field_0x4c));
  auVar5 = vfmadd231ss_fma(auVar5,auVar4,auVar4);
  if (auVar5._0_4_ < 0.0) {
    fVar2 = sqrtf(auVar5._0_4_);
  }
  else {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    fVar2 = auVar5._0_4_;
  }
  fVar3 = vec0->m_floats[1] - (this->P2).m_floats[1];
  auVar5 = ZEXT416((uint)(vec0->m_floats[0] - (this->P2).m_floats[0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar5,auVar5);
  auVar4 = ZEXT416((uint)(vec0->m_floats[2] - (this->P2).m_floats[2]));
  auVar5 = vfmadd231ss_fma(auVar5,auVar4,auVar4);
  if (auVar5._0_4_ < 0.0) {
    fVar3 = sqrtf(auVar5._0_4_);
  }
  else {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    fVar3 = auVar5._0_4_;
  }
  pcVar1 = &this->P2;
  if (fVar2 < fVar3) {
    pcVar1 = (cbtVector3 *)&(this->super_cbtConvexInternalShape).field_0x44;
  }
  cVar6.m_floats._8_8_ = *(undefined8 *)((&this->P2)[(ulong)(fVar3 <= fVar2) - 1].m_floats + 2);
  cVar6.m_floats._0_8_ = *(undefined8 *)pcVar1->m_floats;
  return (cbtVector3)cVar6.m_floats;
}

Assistant:

cbtVector3	cbt2DsegmentShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	
    cbtScalar L1 = (vec0-P1).length();
    cbtScalar L2 = (vec0-P2).length();
    
    if(L1<L2)
        return P1;
       
    return P2;
}